

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void alphamapblend_quint16(int coverage,quint16 *dest,int x,quint16 srcColor)

{
  uint uVar1;
  uint uVar2;
  ushort in_CX;
  int in_EDX;
  long in_RSI;
  uint in_EDI;
  
  if (in_EDI != 0) {
    if (in_EDI == 0xff) {
      *(ushort *)(in_RSI + (long)in_EDX * 2) = in_CX;
    }
    else {
      uVar1 = BYTE_MUL_RGB16((uint)in_CX,in_EDI);
      uVar2 = BYTE_MUL_RGB16((uint)*(ushort *)(in_RSI + (long)in_EDX * 2),0xff - in_EDI);
      *(short *)(in_RSI + (long)in_EDX * 2) = (short)uVar1 + (short)uVar2;
    }
  }
  return;
}

Assistant:

static inline void alphamapblend_quint16(int coverage, quint16 *dest, int x, const quint16 srcColor)
{
    if (coverage == 0) {
        // nothing
    } else if (coverage == 255) {
        dest[x] = srcColor;
    } else {
        dest[x] = BYTE_MUL_RGB16(srcColor, coverage)
                + BYTE_MUL_RGB16(dest[x], 255 - coverage);
    }
}